

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_sched.c
# Opt level: O2

void clock_setunit(_clock *x,double timeunit,int sampflag)

{
  float fVar1;
  t_float tVar2;
  double dVar3;
  double dVar4;
  
  dVar3 = (double)(~-(ulong)(0.0 < timeunit) & 0x3ff0000000000000 |
                  (ulong)timeunit & -(ulong)(0.0 < timeunit));
  fVar1 = x->c_unit;
  if (sampflag == 0) {
    dVar4 = (double)fVar1 * 14112.0;
  }
  else {
    dVar4 = (double)-fVar1;
  }
  if ((dVar3 != dVar4) || (NAN(dVar3) || NAN(dVar4))) {
    if (0.0 <= x->c_settime) {
      dVar4 = (double)fVar1;
      if (fVar1 <= 0.0) {
        dVar4 = dVar4 * (14112000.0 / (double)(pd_maininstance.pd_stuff)->st_dacsr);
      }
      dVar4 = (x->c_settime - pd_maininstance.pd_systime) / dVar4;
    }
    else {
      dVar4 = -1.0;
    }
    if (sampflag == 0) {
      tVar2 = (t_float)(dVar3 * 14112.0);
    }
    else {
      tVar2 = -(float)dVar3;
    }
    x->c_unit = tVar2;
    if (0.0 <= dVar4) {
      dVar3 = (double)x->c_unit;
      if (x->c_unit <= 0.0) {
        dVar3 = dVar3 * (-14112000.0 / (double)(pd_maininstance.pd_stuff)->st_dacsr);
      }
      clock_set(x,dVar3 * dVar4 + pd_maininstance.pd_systime);
      return;
    }
  }
  return;
}

Assistant:

void clock_setunit(t_clock *x, double timeunit, int sampflag)
{
    double timeleft;
    if (timeunit <= 0)
        timeunit = 1;
    /* if no change, return to avoid truncation errors recalculating delay */
    if ((sampflag && (timeunit == -x->c_unit)) ||
        (!sampflag && (timeunit == x->c_unit * TIMEUNITPERMSEC)))
            return;

        /* figure out time left in the units we were in */
    timeleft = (x->c_settime < 0 ? -1 :
        (x->c_settime - pd_this->pd_systime)/((x->c_unit > 0)? x->c_unit :
            (x->c_unit*(TIMEUNITPERSECOND/STUFF->st_dacsr))));
    if (sampflag)
        x->c_unit = -timeunit;  /* negate to flag sample-based */
    else x->c_unit = timeunit * TIMEUNITPERMSEC;
    if (timeleft >= 0)  /* reschedule if already set */
        clock_delay(x, timeleft);
}